

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void __thiscall QCss::ValueExtractor::lengthValues(ValueExtractor *this,Declaration *decl,int *m)

{
  int iVar1;
  P _a;
  ulong uVar2;
  pointer pVVar3;
  ulong uVar4;
  DeclarationData *pDVar5;
  ValueExtractor *this_00;
  QArrayDataPointer<QVariant> *pQVar6;
  long lVar7;
  QVariant **ppQVar8;
  long in_FS_OFFSET;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  LengthData LVar13;
  QArrayDataPointer<QVariant> local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  QArrayDataPointer<QVariant> local_78;
  undefined8 uStack_60;
  Data *local_58;
  QVariant *pQStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (decl->d).d.ptr;
  if (3 < *(ulong *)&(pDVar5->parsed).d.field_0x18) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    ::QVariant::toList();
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x20) {
      LVar13 = qvariant_cast<QCss::LengthData>
                         ((QVariant *)((long)&((local_78.ptr)->d).data + lVar7));
      local_98.shared = (PrivateShared *)LVar13.number;
      local_98._8_4_ = LVar13.unit;
      iVar1 = lengthValueFromData((LengthData *)&local_98,&this->f);
      *m = iVar1;
      m = m + 1;
    }
    pQVar6 = &local_78;
    goto LAB_0053eb7f;
  }
  ppQVar8 = &local_78.ptr;
  local_78.d = (Data *)0xffffffffffffffff;
  local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.size = -1;
  uStack_60 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Data *)0xffffffffffffffff;
  pQStack_50 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = 0xffffffffffffffff;
  uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  lVar7 = 0;
  uVar4 = 0;
  while( true ) {
    uVar2 = (pDVar5->values).d.size;
    if (3 < uVar2) {
      uVar2 = 4;
    }
    if (uVar2 <= uVar4) break;
    this_00 = (ValueExtractor *)&pDVar5->values;
    pVVar3 = QList<QCss::Value>::data((QList<QCss::Value> *)this_00);
    LVar13 = lengthValue(this_00,(Value *)((long)&pVVar3->type + lVar7));
    ((QArrayDataPointer<QVariant> *)(ppQVar8 + -1))->d = (Data *)LVar13.number;
    *(anon_enum_32 *)ppQVar8 = LVar13.unit;
    uVar4 = uVar4 + 1;
    pDVar5 = (decl->d).d.ptr;
    ppQVar8 = ppQVar8 + 2;
    lVar7 = lVar7 + 0x28;
  }
  switch(uVar4 & 0xffffffff) {
  case 0:
    local_48 = 0;
    uStack_40 = (undefined1 *)0x0;
    local_58 = (Data *)0x0;
    pQStack_50 = (QVariant *)0x0;
    local_78.size = 0;
    uStack_60 = (QVariant *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QVariant *)0x0;
    break;
  case 1:
    local_78.size = (qsizetype)local_78.d;
    uStack_60 = local_78.ptr;
    local_58 = local_78.d;
    pQStack_50 = local_78.ptr;
    uVar9 = local_78.d._0_4_;
    uVar10 = local_78.d._4_4_;
    uVar11 = local_78.ptr._0_4_;
    uVar12 = local_78.ptr._4_4_;
    goto LAB_0053eadc;
  case 2:
    local_58 = local_78.d;
    pQStack_50 = local_78.ptr;
    goto LAB_0053eaba;
  case 3:
LAB_0053eaba:
    uVar9 = (undefined4)local_78.size;
    uVar10 = local_78.size._4_4_;
    uVar11 = (undefined4)uStack_60;
    uVar12 = uStack_60._4_4_;
LAB_0053eadc:
    local_48 = CONCAT44(uVar10,uVar9);
    uStack_40 = (undefined1 *)CONCAT44(uVar12,uVar11);
  }
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QVariant *)0x0;
  local_b8.size = 0;
  QList<QVariant>::reserve((QList<QVariant> *)&local_b8,4);
  pQVar6 = &local_78;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    ::QVariant::fromValue<QCss::LengthData>
              ((enable_if_t<std::is_copy_constructible_v<QCss::LengthData>_&&_std::is_destructible_v<QCss::LengthData>,_QVariant>
                *)&local_98,(LengthData *)pQVar6);
    QList<QVariant>::emplaceBack<QVariant>((QList<QVariant> *)&local_b8,(QVariant *)&local_98);
    ::QVariant::~QVariant((QVariant *)&local_98);
    iVar1 = lengthValueFromData((LengthData *)pQVar6,&this->f);
    m[lVar7] = iVar1;
    pQVar6 = (QArrayDataPointer<QVariant> *)&pQVar6->size;
  }
  pQVar6 = &local_b8;
  ::QVariant::QVariant((QVariant *)&local_98,(QList_conflict1 *)pQVar6);
  ::QVariant::operator=(&((decl->d).d.ptr)->parsed,(QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_98);
LAB_0053eb7f:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(pQVar6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValueExtractor::lengthValues(const Declaration &decl, int *m)
{
    if (decl.d->parsed.isValid()) {
        QList<QVariant> v = decl.d->parsed.toList();
        Q_ASSERT(v.size() == 4);
        for (int i = 0; i < 4; i++)
            m[i] = lengthValueFromData(qvariant_cast<LengthData>(v.at(i)), f);
        return;
    }

    LengthData datas[4];
    int i;
    for (i = 0; i < qMin(decl.d->values.size(), 4); i++)
        datas[i] = lengthValue(decl.d->values[i]);

    if (i == 0) {
        LengthData zero = {0.0, LengthData::None};
        datas[0] = datas[1] = datas[2] = datas[3] = zero;
    } else if (i == 1) {
        datas[3] = datas[2] = datas[1] = datas[0];
    } else if (i == 2) {
        datas[2] = datas[0];
        datas[3] = datas[1];
    } else if (i == 3) {
        datas[3] = datas[1];
    }

    QList<QVariant> v;
    v.reserve(4);
    for (i = 0; i < 4; i++) {
        v += QVariant::fromValue<LengthData>(datas[i]);
        m[i] = lengthValueFromData(datas[i], f);
    }
    decl.d->parsed = v;
}